

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O2

int fl_add_symbol(char *name,_func_void_Fl_Color *drawit,int scalable)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  fl_init_symbols();
  iVar2 = symbnumb;
  bVar1 = symbnumb < 0x6a;
  if (bVar1) {
    iVar3 = find(name);
    symbols[iVar3].name = name;
    symbols[iVar3].drawit = drawit;
    symbols[iVar3].notempty = '\x01';
    symbols[iVar3].scalable = (char)scalable;
    symbnumb = iVar2 + 1;
  }
  return (uint)bVar1;
}

Assistant:

int fl_add_symbol(const char *name, void (*drawit)(Fl_Color), int scalable)
{
  fl_init_symbols();
  int pos;
  if (symbnumb > MAXSYMBOL / 2) return 0;	// table is full
  pos = find(name);
  symbols[pos].name = name;
  symbols[pos].drawit = drawit;
  symbols[pos].notempty = 1;
  symbols[pos].scalable = scalable;
  symbnumb++;
  return 1;
}